

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O2

void __thiscall Js::ScriptContext::ProfileBegin(ScriptContext *this,Phase phase)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ScriptContextProfiler *pSVar4;
  
  pSVar4 = this->profiler;
  bVar2 = ConfigFlagsTable::IsEnabled((ConfigFlagsTable *)&Configuration::Global,ProfileFlag);
  if (bVar2 == (pSVar4 == (ScriptContextProfiler *)0x0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0xca0,
                                "((this->profiler != nullptr) == Js::Configuration::Global.flags.IsEnabled(Js::ProfileFlag))"
                                ,"Profiler tag is supplied but the profiler pointer is NULL");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  pSVar4 = this->profiler;
  if (pSVar4 != (ScriptContextProfiler *)0x0) {
    if (this->ensureParentInfo == true) {
      (*this->hostScriptContext->_vptr_HostScriptContext[0x19])(this->hostScriptContext,0);
      this->ensureParentInfo = false;
      pSVar4 = this->profiler;
    }
    ScriptContextProfiler::ProfileBegin(pSVar4,phase);
    return;
  }
  return;
}

Assistant:

void
        ScriptContext::ProfileBegin(Js::Phase phase)
    {
            AssertMsg((this->profiler != nullptr) == Js::Configuration::Global.flags.IsEnabled(Js::ProfileFlag),
                "Profiler tag is supplied but the profiler pointer is NULL");
            if (this->profiler)
            {
                if (this->ensureParentInfo)
                {
                    this->hostScriptContext->EnsureParentInfo();
                    this->ensureParentInfo = false;
                }
                this->profiler->ProfileBegin(phase);
            }
    }